

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LSR_AB(CPU *this)

{
  byte bVar1;
  uint8_t data_00;
  uint16_t uVar2;
  uint8_t data;
  uint8_t addr;
  CPU *this_local;
  
  this->cycles = 6;
  uVar2 = GetWord(this);
  bVar1 = ReadByte(this,uVar2 & 0xff);
  (this->field_6).ps = (this->field_6).ps & 0xfe | ((bVar1 & 1) != 0 && -1 < (int)(bVar1 & 1));
  data_00 = (uint8_t)((int)(uint)bVar1 >> 1);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (data_00 == '\0') << 1;
  (this->field_6).ps = (this->field_6).ps & 0x7f;
  WriteByte(this,uVar2 & 0xff,data_00);
  return;
}

Assistant:

void CPU::LSR_AB()
{
    cycles = 6;
    uint8_t addr = GetWord();
    uint8_t data = ReadByte(addr);
    C = (data & 0b00000001) > 0;
    data >>= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}